

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
pbrt::Tokenizer::Tokenizer
          (Tokenizer *this,void *ptr,size_t len,string *filename,
          function<void_(const_char_*,_const_pbrt::FileLoc_*)> *errorCallback)

{
  string_view filename_00;
  string *this_00;
  function<void_(const_char_*,_const_pbrt::FileLoc_*)> *in_RCX;
  size_t in_RDX;
  size_t in_RSI;
  size_t *in_RDI;
  function<void_(const_char_*,_const_pbrt::FileLoc_*)> *in_R8;
  FileLoc local_40;
  size_t local_18;
  size_t local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  FileLoc::FileLoc((FileLoc *)in_R8);
  std::function<void_(const_char_*,_const_pbrt::FileLoc_*)>::function(in_R8,in_RCX);
  in_RDI[7] = local_10;
  in_RDI[8] = local_18;
  std::__cxx11::string::string((string *)(in_RDI + 9));
  std::__cxx11::string::string((string *)(in_RDI + 0xf));
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string(this_00,(string *)in_RCX);
  filename_00 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
  FileLoc::FileLoc(&local_40,filename_00);
  *in_RDI = local_40.filename._M_len;
  in_RDI[1] = (size_t)local_40.filename._M_str;
  in_RDI[2] = local_40._16_8_;
  in_RDI[0xd] = local_10;
  in_RDI[0xe] = in_RDI[0xd] + local_18;
  return;
}

Assistant:

Tokenizer::Tokenizer(void *ptr, size_t len, std::string filename,
                     std::function<void(const char *, const FileLoc *)> errorCallback)
    : errorCallback(std::move(errorCallback)), unmapPtr(ptr), unmapLength(len) {
    // This is disgusting and leaks memory, but it ensures that the
    // filename in FileLocs returned by the Tokenizer remain valid even
    // after it has been destroyed.
    loc = FileLoc(*new std::string(filename));
    pos = (const char *)ptr;
    end = pos + len;
}